

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O1

RhsTraits * __thiscall
mp::
Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ClassifyRhsLin(RhsTraits *__return_storage_ptr__,
                Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,double b,int v)

{
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  *pCVar1;
  int local_44;
  double local_40;
  vector<int,_std::allocator<int>_> local_38;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->coefs_)._M_elems[0] = b;
  (__return_storage_ptr__->coefs_)._M_elems[1] = b;
  *(undefined8 *)(__return_storage_ptr__->vars_)._M_elems = 0xffffffff;
  local_40 = b;
  std::vector<int,_std::allocator<int>_>::vector(&__return_storage_ptr__->vars2del_,&local_38);
  __return_storage_ptr__->valid_ = false;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0.0 <= local_40) {
    pCVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             GetInitExpressionOfType<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)(this->
                           super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                           ).mc_,v);
    if (pCVar1 != (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                   *)0x0) {
      (__return_storage_ptr__->vars_)._M_elems[1] =
           (pCVar1->
           super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::ExpId>).args_.
           _M_elems[0];
      local_44 = v;
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->vars2del_,&local_44);
      __return_storage_ptr__->valid_ = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RhsTraits ClassifyRhsLin(double b, int v) {
    assert(v>=0);
    RhsTraits result {{b, b}, {-1} /*y = constant 1*/};
    if (b>=0.0) {
      if (auto pConExp = MC().template
          GetInitExpressionOfType<ExpConstraint>(v)) {
        result.vars_[1] = pConExp->GetArguments()[0];  // the z
        result.vars2del_ = {v};                        // delete v
        result.valid_ = true;
      }
    }
    return result;
  }